

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O1

TestCaseGroup * vkt::tessellation::createMiscDrawTests(TestContext *testCtx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  CaseDefinition *in_R9;
  int iVar7;
  string caseName;
  CaseDefinition caseDef_2;
  CaseDefinition caseDef_1;
  CaseDefinition caseDef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ShaderType local_e4;
  TestCaseGroup *local_e0;
  long local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  long local_b0;
  undefined4 local_a8;
  int local_a4;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  ShaderType local_80;
  int local_7c;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  ShaderType local_58;
  int local_54;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_e0 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (local_e0,testCtx,"misc_draw","Miscellaneous draw-result-verifying cases");
  paVar1 = &local_128.field_2;
  lVar3 = 0;
  do {
    local_e4 = createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar3];
    local_b0 = (long)(int)local_e4;
    iVar7 = 0;
    local_d8 = lVar3;
    do {
      local_d0 = &local_c0;
      local_c8 = 0;
      local_c0 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_138 = *plVar4;
        lStack_130 = plVar2[3];
        local_148 = &local_138;
      }
      else {
        local_138 = *plVar4;
        local_148 = (long *)*plVar2;
      }
      local_140 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_148);
      puVar5 = (ulong *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5) {
        local_128.field_2._M_allocated_capacity = *puVar5;
        local_128.field_2._8_8_ = plVar2[3];
        local_128._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_128.field_2._M_allocated_capacity = *puVar5;
        local_128._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_128._M_string_length = plVar2[1];
      *plVar2 = (long)puVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_128);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      psVar6 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_168.field_2._M_allocated_capacity = *psVar6;
        local_168.field_2._8_8_ = plVar2[3];
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar6;
        local_168._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_168._M_string_length = plVar2[1];
      *plVar2 = (long)psVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_168);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar6 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_108.field_2._M_allocated_capacity = *psVar6;
        local_108.field_2._8_8_ = plVar2[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar6;
        local_108._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_108._M_string_length = plVar2[1];
      *plVar2 = (long)psVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,local_138 + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,
                 "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape"
                 ,"");
      std::operator+(&local_168,"vulkan/data/tessellation/",&local_108);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_168);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_138 = *plVar4;
        lStack_130 = plVar2[3];
        local_148 = &local_138;
      }
      else {
        local_138 = *plVar4;
        local_148 = (long *)*plVar2;
      }
      local_140 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
      local_58 = local_e4;
      local_54 = iVar7;
      std::__cxx11::string::_M_assign((string *)&local_50);
      addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
                (local_e0,&local_108,&local_128,anon_unknown_2::initProgramsFillCoverCase,
                 (Function)&local_58,in_R9);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,local_138 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 3);
    lVar3 = local_d8 + 1;
  } while (local_d8 == 0);
  lVar3 = 0;
  do {
    local_e4 = createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar3];
    local_b0 = (long)(int)local_e4;
    iVar7 = 0;
    local_d8 = lVar3;
    do {
      local_d0 = &local_c0;
      local_c8 = 0;
      local_c0 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_138 = *plVar4;
        lStack_130 = plVar2[3];
        local_148 = &local_138;
      }
      else {
        local_138 = *plVar4;
        local_148 = (long *)*plVar2;
      }
      local_140 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_148);
      puVar5 = (ulong *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5) {
        local_128.field_2._M_allocated_capacity = *puVar5;
        local_128.field_2._8_8_ = plVar2[3];
        local_128._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_128.field_2._M_allocated_capacity = *puVar5;
        local_128._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_128._M_string_length = plVar2[1];
      *plVar2 = (long)puVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_128);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      psVar6 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_168.field_2._M_allocated_capacity = *psVar6;
        local_168.field_2._8_8_ = plVar2[3];
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar6;
        local_168._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_168._M_string_length = plVar2[1];
      *plVar2 = (long)psVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_168);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar6 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_108.field_2._M_allocated_capacity = *psVar6;
        local_108.field_2._8_8_ = plVar2[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar6;
        local_108._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_108._M_string_length = plVar2[1];
      *plVar2 = (long)psVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,local_138 + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,
                 "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape"
                 ,"");
      std::operator+(&local_168,"vulkan/data/tessellation/",&local_108);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_168);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_138 = *plVar4;
        lStack_130 = plVar2[3];
        local_148 = &local_138;
      }
      else {
        local_138 = *plVar4;
        local_148 = (long *)*plVar2;
      }
      local_140 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      local_78 = &local_68;
      local_70 = 0;
      local_68 = 0;
      local_80 = local_e4;
      local_7c = iVar7;
      std::__cxx11::string::_M_assign((string *)&local_78);
      addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
                (local_e0,&local_108,&local_128,anon_unknown_2::initProgramsFillNonOverlapCase,
                 (Function)&local_80,in_R9);
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,local_138 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 3);
    lVar3 = local_d8 + 1;
  } while (local_d8 == 0);
  iVar7 = 0;
  do {
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity =
         local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_128._M_dataplus._M_p = (pointer)paVar1;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_128);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    psVar6 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_168.field_2._M_allocated_capacity = *psVar6;
      local_168.field_2._8_8_ = plVar2[3];
    }
    else {
      local_168.field_2._M_allocated_capacity = *psVar6;
      local_168._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_168._M_string_length = plVar2[1];
    *plVar2 = (long)psVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_168);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar6 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_108.field_2._M_allocated_capacity = *psVar6;
      local_108.field_2._8_8_ = plVar2[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar6;
      local_108._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_108._M_string_length = plVar2[1];
    *plVar2 = (long)psVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"Basic isolines render test","");
    std::operator+(&local_168,"vulkan/data/tessellation/",&local_108);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_168);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_138 = *plVar4;
      lStack_130 = plVar2[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *plVar4;
      local_148 = (long *)*plVar2;
    }
    local_140 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    local_a0 = &local_90;
    local_98 = 0;
    local_90 = 0;
    local_a8 = 2;
    local_a4 = iVar7;
    std::__cxx11::string::_M_assign((string *)&local_a0);
    addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
              (local_e0,&local_108,&local_128,anon_unknown_2::initProgramsIsolinesCase,
               (Function)&local_a8,in_R9);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 3);
  return local_e0;
}

Assistant:

tcu::TestCaseGroup* createMiscDrawTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "misc_draw", "Miscellaneous draw-result-verifying cases"));

	static const TessPrimitiveType primitivesNoIsolines[] =
	{
		TESSPRIMITIVETYPE_TRIANGLES,
		TESSPRIMITIVETYPE_QUADS,
	};

	// Triangle fill case
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitivesNoIsolines); ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitivesNoIsolines[primitiveTypeNdx];
		const SpacingMode		spacingMode	  = static_cast<SpacingMode>(spacingModeNdx);
		const std::string		caseName	  = std::string() + "fill_cover_" + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape",
									initProgramsFillCoverCase, runTest, makeCaseDefinition(primitiveType, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	// Triangle non-overlap case
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitivesNoIsolines); ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitivesNoIsolines[primitiveTypeNdx];
		const SpacingMode		spacingMode	  = static_cast<SpacingMode>(spacingModeNdx);
		const std::string		caseName	  = std::string() + "fill_overlap_" + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape",
									initProgramsFillNonOverlapCase, runTest, makeCaseDefinition(primitiveType, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	// Isolines
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const SpacingMode spacingMode = static_cast<SpacingMode>(spacingModeNdx);
		const std::string caseName    = std::string() + "isolines_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Basic isolines render test",
									initProgramsIsolinesCase, runTest, makeCaseDefinition(TESSPRIMITIVETYPE_ISOLINES, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	return group.release();
}